

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsOrientFaceSides(FmsInt num_sides,FmsInt num_faces,FmsInt *face_verts,
                      FmsOrientation *orientations)

{
  FmsInt FVar1;
  FmsInt FVar2;
  bool bVar3;
  undefined8 uVar4;
  FmsInt FVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  FmsInt *pFVar15;
  FmsInt *pFVar16;
  bool bVar17;
  ulong auStack_78 [4];
  FmsInt aFStack_58 [2];
  FmsInt nc [4];
  FmsInt vi [4];
  
  uVar8 = (uint)num_sides;
  if (num_faces != 0) {
    uVar13 = 1;
    if (1 < (int)uVar8) {
      uVar13 = num_sides & 0xffffffff;
    }
    pFVar16 = face_verts + 1;
    bVar17 = true;
    uVar14 = 0;
    do {
      if (0 < (long)num_sides) {
        lVar7 = 0;
        iVar9 = uVar8 - 1;
        do {
          lVar6 = (long)((iVar9 % (int)uVar8) * 2);
          FVar5 = face_verts[lVar6];
          FVar1 = *(FmsInt *)((long)face_verts + lVar7 * 2);
          if ((FVar5 == FVar1) || (FVar5 == *(FmsInt *)((long)face_verts + lVar7 * 2 + 8))) {
            *(FmsInt *)((long)aFStack_58 + lVar7) = FVar5;
            uVar4 = 1;
            bVar3 = false;
          }
          else {
            uVar4 = 0;
            bVar3 = true;
          }
          FVar2 = face_verts[lVar6 + 1];
          if ((FVar5 == FVar2) ||
             ((FVar2 != FVar1 && (FVar2 != *(FmsInt *)((long)face_verts + lVar7 * 2 + 8))))) {
            *(undefined8 *)((long)auStack_78 + lVar7) = uVar4;
            if (bVar3) {
              return (uint)bVar17;
            }
          }
          else {
            *(FmsInt *)((long)aFStack_58 + lVar7) = FVar2;
            *(ulong *)((long)auStack_78 + lVar7) = (ulong)((int)uVar4 + 1);
          }
          lVar7 = lVar7 + 8;
          iVar9 = iVar9 + 1;
        } while (uVar13 * 8 - lVar7 != 0);
        if (0 < (long)num_sides) {
          uVar10 = 0;
          pFVar15 = pFVar16;
          do {
            uVar11 = uVar10 + 1;
            if ((pFVar15[-1] != *pFVar15) &&
               ((FVar5 = pFVar15[-1], uVar12 = uVar10, auStack_78[uVar10] == 1 ||
                (uVar12 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
                          (long)(int)uVar8 & 0xffffffff, FVar5 = *pFVar15, auStack_78[uVar12] == 1))
               )) {
              orientations[uVar10] = aFStack_58[uVar12] != FVar5;
            }
            pFVar15 = pFVar15 + 2;
            uVar10 = uVar11;
          } while (uVar13 != uVar11);
        }
      }
      orientations = orientations + (num_sides & 0xffffffff);
      face_verts = face_verts + (ulong)(uVar8 & 0x7fffffff) * 2;
      uVar14 = uVar14 + 1;
      pFVar16 = pFVar16 + (ulong)(uVar8 & 0x7fffffff) * 2;
      bVar17 = uVar14 < num_faces;
    } while (uVar14 != num_faces);
  }
  return 0;
}

Assistant:

static int FmsOrientFaceSides(FmsInt num_sides, FmsInt num_faces,
                              FmsInt *face_verts,
                              FmsOrientation *orientations) {
  // The size of 'face_verts' must be 2 x 'num_sides' x 'num_faces'.
  // The size of 'orientations' must be 'num_sides' x 'num_faces'.

  // Find edge orientations that if applied to 'face_verts' lead to an array of
  // the form: (a,b,b,c,c,a), for triangles, or (a,b,b,c,c,d,d,a), for quads.
  // If one of the edge orientations cannot be uniquely determined, that edge in
  // the 'orientations' array will remain unmodified, e.g. as initialized by the
  // user.

  const int n = num_sides;
  for (FmsInt k = 0; k < num_faces; k++) {
    FmsInt nc[4], vi[4]; // at most 4 vertices/sides
    for (int i = 0; i < n; i++) {
      nc[i] = FmsIntersectTwoEdges(face_verts+2*((i+n-1)%n),
                                   face_verts+2*i, vi+i);
      if (nc[i] == 0) { E_RETURN(1); }
    }
    for (int ei = 0; ei < n; ei++) {
      int ej = (ei+1)%n;
      if (face_verts[2*ei+0] == face_verts[2*ei+1] ||
          (nc[ei] != 1 && nc[ej] != 1)) {
        // Keep the value of 'orientations[ei]' as is, e.g. as defined by the
        // user.
      } else {
        if (nc[ei] == 1) {
          orientations[ei] = (vi[ei] == face_verts[2*ei+0]) ? 0 : 1;
        } else {
          orientations[ei] = (vi[ej] == face_verts[2*ei+1]) ? 0 : 1;
        }
      }
    }
    face_verts += 2*n;
    orientations += n;
  }
  return 0;
}